

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.c++
# Opt level: O2

void __thiscall
capnp::InputStreamMessageReader::InputStreamMessageReader
          (InputStreamMessageReader *this,InputStream *inputStream,ReaderOptions options,
          ArrayPtr<capnp::word> scratchSpace)

{
  ArrayPtr<const_capnp::word> *pAVar1;
  uint i;
  byte **ppbVar2;
  long lVar3;
  ssize_t sVar4;
  DirectWireValue<unsigned_int> *pDVar5;
  ulong uVar6;
  size_t __nbytes;
  ulong uVar7;
  uint uVar8;
  word *pwVar9;
  word *pwVar10;
  uint uVar11;
  ulong uVar12;
  ReaderOptions options_00;
  ulong local_e8;
  Array<capnp::_::DirectWireValue<unsigned_int>_> moreSizes_heap;
  WireValue<uint32_t> firstWord [2];
  Fault f_1;
  WireValue<uint32_t> moreSizes_stack [16];
  
  pwVar10 = scratchSpace.ptr;
  __nbytes = options._8_8_;
  uVar7 = options.traversalLimitInWords;
  options_00._12_4_ = 0;
  options_00.traversalLimitInWords = SUB128(options._0_12_,0);
  options_00.nestingLimit = SUB124(options._0_12_,8);
  MessageReader::MessageReader(&this->super_MessageReader,options_00);
  (this->super_MessageReader)._vptr_MessageReader =
       (_func_int **)&PTR__InputStreamMessageReader_0021eaf0;
  this->inputStream = inputStream;
  this->readPos = (byte *)0x0;
  (this->segment0).ptr = (word *)0x0;
  (this->segment0).size_ = 0;
  (this->moreSegments).ptr = (ArrayPtr<const_capnp::word> *)0x0;
  (this->moreSegments).size_ = 0;
  (this->moreSegments).disposer = (ArrayDisposer *)0x0;
  (this->ownedSpace).ptr = (word *)0x0;
  (this->ownedSpace).size_ = 0;
  (this->ownedSpace).disposer = (ArrayDisposer *)0x0;
  kj::UnwindDetector::UnwindDetector(&this->unwindDetector);
  kj::InputStream::read(inputStream,(int)firstWord,(void *)0x8,__nbytes);
  uVar8 = firstWord[0].value + 1;
  if (uVar8 == 0) {
    local_e8 = 0;
    uVar8 = 0;
  }
  else {
    local_e8 = (ulong)firstWord[1].value;
    if (uVar8 < 0x200) {
      uVar11 = uVar8 & 0x1fe;
      uVar12 = local_e8;
      if (uVar11 < 0x11) {
        moreSizes_heap.disposer = (ArrayDisposer *)0x0;
        moreSizes_heap.ptr = (DirectWireValue<unsigned_int> *)0x0;
        moreSizes_heap.size_ = 0;
        pDVar5 = moreSizes_stack;
        if ((ulong)firstWord[0].value == 0) {
          uVar8 = 1;
          goto LAB_001a0a24;
        }
      }
      else {
        pDVar5 = kj::_::HeapArrayDisposer::allocate<capnp::_::DirectWireValue<unsigned_int>>
                           ((ulong)uVar11);
        moreSizes_heap.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
        moreSizes_heap.ptr = pDVar5;
        moreSizes_heap.size_ = (ulong)uVar11;
      }
      kj::InputStream::read(inputStream,(int)pDVar5,(void *)(ulong)(uVar11 * 4),__nbytes);
      for (uVar6 = 0; firstWord[0].value != uVar6; uVar6 = uVar6 + 1) {
        __nbytes = (size_t)pDVar5[uVar6].value;
        uVar12 = uVar12 + __nbytes;
      }
      goto LAB_001a0a24;
    }
    __nbytes = 0;
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[31]>
              ((Fault *)moreSizes_stack,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/serialize.c++"
               ,0xba,FAILED,"segmentCount < 512","\"Message has too many segments.\"",
               (char (*) [31])"Message has too many segments.");
    kj::_::Debug::Fault::~Fault((Fault *)moreSizes_stack);
    uVar8 = 1;
  }
  moreSizes_heap.disposer = (ArrayDisposer *)0x0;
  moreSizes_heap.ptr = (DirectWireValue<unsigned_int> *)0x0;
  moreSizes_heap.size_ = 0;
  pDVar5 = moreSizes_stack;
  uVar12 = local_e8;
  local_e8 = (ulong)uVar8;
LAB_001a0a24:
  if (uVar7 < uVar12) {
    __nbytes = 0;
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[93]>
              (&f_1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/serialize.c++"
               ,0xce,FAILED,"totalWords <= options.traversalLimitInWords",
               "\"Message is too large.  To increase the limit on the receiving end, see \" \"capnp::ReaderOptions.\""
               ,(char (*) [93])
                "Message is too large.  To increase the limit on the receiving end, see capnp::ReaderOptions."
              );
    kj::_::Debug::Fault::~Fault(&f_1);
    uVar12 = local_e8;
    if (uVar7 < local_e8) {
      uVar12 = uVar7;
    }
    uVar8 = 1;
    local_e8 = uVar12;
  }
  if (scratchSpace.size_ < uVar12) {
    f_1.exception = (Exception *)kj::_::HeapArrayDisposer::allocate<capnp::word>(uVar12);
    kj::Array<capnp::word>::operator=(&this->ownedSpace,(Array<capnp::word> *)&f_1);
    kj::Array<capnp::word>::~Array((Array<capnp::word> *)&f_1);
    pwVar10 = (this->ownedSpace).ptr;
  }
  local_e8 = local_e8 & 0xffffffff;
  (this->segment0).ptr = pwVar10;
  (this->segment0).size_ = local_e8;
  if (uVar8 < 2) {
    if (uVar8 == 1) {
      kj::InputStream::read(inputStream,(int)pwVar10,(void *)(uVar12 << 3),__nbytes);
    }
  }
  else {
    f_1.exception =
         (Exception *)
         kj::_::HeapArrayDisposer::allocate<kj::ArrayPtr<capnp::word_const>>((ulong)(uVar8 - 1));
    kj::Array<kj::ArrayPtr<const_capnp::word>_>::operator=
              (&this->moreSegments,(Array<kj::ArrayPtr<const_capnp::word>_> *)&f_1);
    ppbVar2 = &this->readPos;
    kj::Array<kj::ArrayPtr<const_capnp::word>_>::~Array
              ((Array<kj::ArrayPtr<const_capnp::word>_> *)&f_1);
    uVar7 = local_e8;
    for (lVar3 = 0; (ulong)(uVar8 - 1) << 2 != lVar3; lVar3 = lVar3 + 4) {
      uVar6 = (ulong)*(uint *)((long)&pDVar5->value + lVar3);
      pwVar9 = pwVar10 + uVar7;
      uVar7 = uVar7 + uVar6;
      pAVar1 = (this->moreSegments).ptr;
      *(word **)((long)&pAVar1->ptr + lVar3 * 4) = pwVar9;
      *(ulong *)((long)&pAVar1->size_ + lVar3 * 4) = uVar6;
    }
    *ppbVar2 = (byte *)pwVar10;
    sVar4 = kj::InputStream::read(inputStream,(int)pwVar10,(void *)(local_e8 << 3),uVar12 << 3);
    *ppbVar2 = *ppbVar2 + sVar4;
  }
  kj::Array<capnp::_::DirectWireValue<unsigned_int>_>::~Array(&moreSizes_heap);
  return;
}

Assistant:

InputStreamMessageReader::InputStreamMessageReader(
    kj::InputStream& inputStream, ReaderOptions options, kj::ArrayPtr<word> scratchSpace)
    : MessageReader(options), inputStream(inputStream), readPos(nullptr) {
  _::WireValue<uint32_t> firstWord[2];

  inputStream.read(firstWord, sizeof(firstWord));

  uint segmentCount = firstWord[0].get() + 1;
  uint segment0Size = segmentCount == 0 ? 0 : firstWord[1].get();

  size_t totalWords = segment0Size;

  // Reject messages with too many segments for security reasons.
  KJ_REQUIRE(segmentCount < 512, "Message has too many segments.") {
    segmentCount = 1;
    segment0Size = 1;
    break;
  }

  // Read sizes for all segments except the first.  Include padding if necessary.
  KJ_STACK_ARRAY(_::WireValue<uint32_t>, moreSizes, segmentCount & ~1, 16, 64);
  if (segmentCount > 1) {
    inputStream.read(moreSizes.begin(), moreSizes.size() * sizeof(moreSizes[0]));
    for (uint i = 0; i < segmentCount - 1; i++) {
      totalWords += moreSizes[i].get();
    }
  }

  // Don't accept a message which the receiver couldn't possibly traverse without hitting the
  // traversal limit.  Without this check, a malicious client could transmit a very large segment
  // size to make the receiver allocate excessive space and possibly crash.
  KJ_REQUIRE(totalWords <= options.traversalLimitInWords,
             "Message is too large.  To increase the limit on the receiving end, see "
             "capnp::ReaderOptions.") {
    segmentCount = 1;
    segment0Size = kj::min(segment0Size, options.traversalLimitInWords);
    totalWords = segment0Size;
    break;
  }

  if (scratchSpace.size() < totalWords) {
    // TODO(perf):  Consider allocating each segment as a separate chunk to reduce memory
    //   fragmentation.
    ownedSpace = kj::heapArray<word>(totalWords);
    scratchSpace = ownedSpace;
  }

  segment0 = scratchSpace.slice(0, segment0Size);

  if (segmentCount > 1) {
    moreSegments = kj::heapArray<kj::ArrayPtr<const word>>(segmentCount - 1);
    size_t offset = segment0Size;

    for (uint i = 0; i < segmentCount - 1; i++) {
      uint segmentSize = moreSizes[i].get();
      moreSegments[i] = scratchSpace.slice(offset, offset + segmentSize);
      offset += segmentSize;
    }
  }

  if (segmentCount == 1) {
    inputStream.read(scratchSpace.begin(), totalWords * sizeof(word));
  } else if (segmentCount > 1) {
    readPos = scratchSpace.asBytes().begin();
    readPos += inputStream.read(readPos, segment0Size * sizeof(word), totalWords * sizeof(word));
  }
}